

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O0

uint32_t __thiscall
dg::llvmdg::LLVMSlicer::slice
          (LLVMSlicer *this,LLVMDependenceGraph *dg,LLVMNode *start,uint32_t sl_id)

{
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  reference ppFVar4;
  PointerType *pPVar5;
  uint32_t in_ECX;
  long in_RDX;
  LLVMDependenceGraph *in_RSI;
  undefined1 auVar6 [16];
  Function *F_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> *__range2_1;
  LLVMDependenceGraph *subdg;
  iterator it;
  Function *F;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> to_erase;
  bool in_stack_00000113;
  uint32_t in_stack_00000114;
  LLVMNode *in_stack_00000118;
  Slicer<dg::LLVMNode> *in_stack_00000120;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Function *in_stack_ffffffffffffff40;
  Function *in_stack_ffffffffffffff50;
  __normal_iterator<llvm::Function_**,_std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>_>
  in_stack_ffffffffffffff60;
  LLVMDependenceGraph *in_stack_ffffffffffffff68;
  LLVMSlicer *in_stack_ffffffffffffff70;
  LLVMSlicer *in_stack_ffffffffffffff78;
  _Self local_80;
  LLVMSlicer *local_78;
  _Self local_70;
  undefined1 local_68 [16];
  LLVMSlicer *local_58;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_50;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_48;
  Module *local_40;
  uint32_t local_1c;
  LLVMDependenceGraph *local_10;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  if (in_RDX != 0) {
    local_1c = Slicer<dg::LLVMNode>::mark
                         (in_stack_00000120,in_stack_00000118,in_stack_00000114,in_stack_00000113);
  }
  std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>::vector
            ((vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> *)0x1cd65d);
  local_40 = LLVMDependenceGraph::getModule(local_10);
  local_48.NodePtr =
       (node_pointer)
       llvm::Module::begin((Module *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_50.NodePtr =
       (node_pointer)
       llvm::Module::end((Module *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  while( true ) {
    bVar1 = llvm::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    local_58 = (LLVMSlicer *)
               llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                            *)0x1cd6c1);
    auVar6 = llvm::Value::getName();
    local_68 = auVar6;
    bVar1 = dontTouch(in_stack_ffffffffffffff78,(StringRef *)in_stack_ffffffffffffff70);
    if (!bVar1) {
      local_78 = local_58;
      local_70._M_node =
           (_Base_ptr)
           std::
           map<const_llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
           ::find((map<const_llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                  (key_type *)0x1cd70f);
      local_80._M_node =
           (_Base_ptr)
           std::
           map<const_llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
           ::end((map<const_llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      bVar1 = std::operator==(&local_70,&local_80);
      if (bVar1) {
        uVar2 = llvm::GlobalValue::isDeclaration();
        if ((uVar2 & 1) == 0) {
          in_stack_ffffffffffffff78 = local_58;
          std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>::push_back
                    ((vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> *)
                     in_stack_ffffffffffffff40,
                     (value_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        }
      }
      else {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>
                               *)0x1cd770);
        in_stack_ffffffffffffff70 = (LLVMSlicer *)ppVar3->second;
        sliceGraph(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (uint32_t)((ulong)in_stack_ffffffffffffff60._M_current >> 0x20));
      }
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                  *)in_stack_ffffffffffffff40);
  }
  std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>::begin
            ((vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>::end
            ((vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<llvm::Function_**,_std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<llvm::Function_**,_std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (!bVar1) break;
    ppFVar4 = __gnu_cxx::
              __normal_iterator<llvm::Function_**,_std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>_>
              ::operator*((__normal_iterator<llvm::Function_**,_std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>_>
                           *)&stack0xffffffffffffff60);
    in_stack_ffffffffffffff40 = *ppFVar4;
    in_stack_ffffffffffffff50 = in_stack_ffffffffffffff40;
    pPVar5 = llvm::GlobalValue::getType((GlobalValue *)0x1cd809);
    llvm::UndefValue::get((Type *)pPVar5);
    llvm::Value::replaceAllUsesWith((Value *)in_stack_ffffffffffffff40);
    llvm::Function::deleteBody(in_stack_ffffffffffffff40);
    llvm::Function::eraseFromParent();
    __gnu_cxx::
    __normal_iterator<llvm::Function_**,_std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>_>
    ::operator++((__normal_iterator<llvm::Function_**,_std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>_>
                  *)&stack0xffffffffffffff60);
  }
  std::vector<llvm::Function_*,_std::allocator<llvm::Function_*>_>::~vector
            ((vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> *)
             in_stack_ffffffffffffff50);
  return local_1c;
}

Assistant:

uint32_t slice(LLVMDependenceGraph *dg, LLVMNode *start,
                   uint32_t sl_id = 0) {
        // mark nodes for slicing
        assert(start || sl_id != 0);
        if (start)
            sl_id = mark(start, sl_id);

        std::vector<llvm::Function *> to_erase;
        for (auto &F : *dg->getModule()) {
            if (dontTouch(F.getName()))
                continue;

            auto it = constructedFunctions.find(&F);
            if (it == constructedFunctions.end()) {
                // remove (defined) functions that we didn't even constructed,
                // those are irrelevant in the slice
                if (!F.isDeclaration()) {
                    to_erase.push_back(&F);
                }
            } else {
                LLVMDependenceGraph *subdg = it->second;
                sliceGraph(subdg, sl_id);
            }
        }
        for (auto *F : to_erase) {
            F->replaceAllUsesWith(llvm::UndefValue::get(F->getType()));
            F->deleteBody();
            F->eraseFromParent();
        }

        return sl_id;
    }